

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::draw_vline
          (Fl_Text_Display *this,int visLineNum,int leftClip,int rightClip,int leftCharIndex,
          int rightCharIndex)

{
  int iVar1;
  int lineStartPos_00;
  int leftClip_00;
  int rightClip_00;
  int Y_00;
  int local_38;
  int fontHeight;
  int lineLen;
  int lineStartPos;
  int Y;
  int rightCharIndex_local;
  int leftCharIndex_local;
  int rightClip_local;
  int leftClip_local;
  int visLineNum_local;
  Fl_Text_Display *this_local;
  
  if ((-1 < visLineNum) && (visLineNum < this->mNVisibleLines)) {
    iVar1 = this->mMaxsize;
    Y_00 = (this->text_area).y + visLineNum * iVar1;
    lineStartPos_00 = this->mLineStarts[visLineNum];
    if (lineStartPos_00 == -1) {
      local_38 = 0;
    }
    else {
      local_38 = vline_length(this,visLineNum);
    }
    leftClip_00 = max((this->text_area).x,leftClip);
    rightClip_00 = min(rightClip,(this->text_area).x + (this->text_area).w);
    handle_vline(this,0,lineStartPos_00,local_38,leftCharIndex,rightCharIndex,Y_00,Y_00 + iVar1,
                 leftClip_00,rightClip_00);
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_vline(int visLineNum, int leftClip, int rightClip,
                                 int leftCharIndex, int rightCharIndex) {
  int Y, lineStartPos, lineLen, fontHeight;

  //  printf("draw_vline(visLineNum=%d, leftClip=%d, rightClip=%d, leftCharIndex=%d, rightCharIndex=%d)\n",
  //         visLineNum, leftClip, rightClip, leftCharIndex, rightCharIndex);
  //  printf("nNVisibleLines=%d\n", mNVisibleLines);

  /* If line is not displayed, skip it */
  if ( visLineNum < 0 || visLineNum >= mNVisibleLines )
    return;

  /* Calculate Y coordinate of the string to draw */
  fontHeight = mMaxsize;
  Y = text_area.y + visLineNum * fontHeight;

  /* Get the text, length, and  buffer position of the line to display */
  lineStartPos = mLineStarts[ visLineNum ];
  if ( lineStartPos == -1 ) {
    lineLen = 0;
  } else {
    lineLen = vline_length( visLineNum );
  }

  /* Shrink the clipping range to the active display area */
  leftClip = max( text_area.x, leftClip );
  rightClip = min( rightClip, text_area.x + text_area.w );

  handle_vline(DRAW_LINE,
               lineStartPos, lineLen, leftCharIndex, rightCharIndex,
               Y, Y+fontHeight, leftClip, rightClip);
  return;
}